

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O1

void testing::internal::PrintRawArrayTo<nsh_cmd>(nsh_cmd *a,size_t count,ostream *os)

{
  long lVar1;
  nsh_cmd *obj_bytes;
  
  PrintBytesInObjectTo((uchar *)a,0x18,os);
  if (count != 1) {
    lVar1 = count - 1;
    obj_bytes = a + 1;
    do {
      std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
      PrintBytesInObjectTo((uchar *)obj_bytes,0x18,os);
      obj_bytes = obj_bytes + 1;
      lVar1 = lVar1 + -1;
    } while (lVar1 != 0);
  }
  return;
}

Assistant:

void PrintRawArrayTo(const T a[], size_t count, ::std::ostream* os) {
  UniversalPrint(a[0], os);
  for (size_t i = 1; i != count; i++) {
    *os << ", ";
    UniversalPrint(a[i], os);
  }
}